

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int32 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this,int64 position)

{
  __off64_t in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_4 = -1;
  }
  else {
    local_4 = fseeko64(*(FILE **)(in_RDI + 8),in_RSI,0);
  }
  return local_4;
}

Assistant:

int32 MkvWriter::Position(int64 position) {
  if (!file_)
    return -1;

#ifdef _MSC_VER
  return _fseeki64(file_, position, SEEK_SET);
#elif defined(_WIN32)
  return fseeko64(file_, static_cast<off_t>(position), SEEK_SET);
#elif !(defined(__ANDROID__) && __ANDROID_API__ < 24 && !defined(__LP64__) && \
        defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64)
  // POSIX.1 has fseeko and ftello. fseeko and ftello are not available before
  // Android API level 24. See
  // https://android.googlesource.com/platform/bionic/+/main/docs/32-bit-abi.md
  return fseeko(file_, static_cast<off_t>(position), SEEK_SET);
#else
  return fseek(file_, static_cast<long>(position), SEEK_SET);
#endif
}